

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

char * luaL_gsub(lua_State *L,char *s,char *p,char *r)

{
  size_t sVar1;
  char *pcVar2;
  luaL_Buffer b;
  
  sVar1 = strlen(p);
  b.b = b.initb;
  b.n = 0;
  b.size = 0x2000;
  b.L = L;
  while( true ) {
    pcVar2 = strstr(s,p);
    if (pcVar2 == (char *)0x0) break;
    luaL_addlstring(&b,s,(long)pcVar2 - (long)s);
    luaL_addstring(&b,r);
    s = pcVar2 + sVar1;
  }
  luaL_addstring(&b,s);
  luaL_pushresult(&b);
  pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
  return pcVar2;
}

Assistant:

LUALIB_API const char *luaL_gsub (lua_State *L, const char *s,
                                  const char *p, const char *r) {
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  luaL_addgsub(&b, s, p, r);
  luaL_pushresult(&b);
  return lua_tostring(L, -1);
}